

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O0

apx_rationalScaling_t * apx_rationalScaling_clone(apx_rationalScaling_t *other)

{
  apx_rationalScaling_t *self;
  apx_rationalScaling_t *other_local;
  
  if (other == (apx_rationalScaling_t *)0x0) {
    other_local = (apx_rationalScaling_t *)0x0;
  }
  else {
    other_local = apx_rationalScaling_new
                            (other->offset,other->numerator,other->denominator,other->unit);
    if (other_local != (apx_rationalScaling_t *)0x0) {
      apx_computation_assign(&other_local->base,&other->base);
    }
  }
  return other_local;
}

Assistant:

apx_rationalScaling_t* apx_rationalScaling_clone(apx_rationalScaling_t const* other)
{
   if (other != NULL)
   {
      apx_rationalScaling_t* self = apx_rationalScaling_new(other->offset, other->numerator, other->denominator, other->unit);
      if (self != NULL)
      {
         apx_computation_assign(&self->base, &other->base);
      }
      return self;
   }
   return NULL;
}